

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# romfs.cpp
# Opt level: O2

error_or<unsigned_long> * __thiscall
pstore::romfs::open_file::seek
          (error_or<unsigned_long> *__return_storage_ptr__,open_file *this,off_t offset,
          seek_mode whence)

{
  unsigned_long uVar1;
  ulong uVar2;
  size_t new_pos;
  unsigned_long local_10;
  
  local_10 = 0;
  if (whence == end) {
    uVar2 = (this->dir_->stat_).size;
    if (uVar2 < (ulong)-offset && offset < 0) {
LAB_00168089:
      seek::anon_class_1_0_00000001::operator()
                (__return_storage_ptr__,(anon_class_1_0_00000001 *)this,(error_code)offset);
      return __return_storage_ptr__;
    }
  }
  else {
    if (whence != cur) {
      uVar1 = local_10;
      if ((whence == set) && (uVar1 = offset, offset < 0)) goto LAB_00168089;
      goto LAB_001680ae;
    }
    if (-1 < offset) {
      uVar1 = offset + this->pos_;
      goto LAB_001680ae;
    }
    uVar2 = this->pos_;
    if (uVar2 < (ulong)-offset) goto LAB_00168089;
  }
  uVar1 = offset + uVar2;
LAB_001680ae:
  local_10 = uVar1;
  this->pos_ = local_10;
  error_or<unsigned_long>::error_or<unsigned_long&,void>(__return_storage_ptr__,&local_10);
  return __return_storage_ptr__;
}

Assistant:

error_or<std::size_t> open_file::seek (off_t const offset, seek_mode const whence) {
            auto make_error = [] (error_code const erc) {
                return error_or<std::size_t> (make_error_code (erc));
            };
            using uoff_type = std::make_unsigned<off_t>::type;
            std::size_t new_pos = 0;
            std::size_t const file_size = dir_.stat ().size;
            switch (whence) {
            case seek_mode::set:
                if (offset < 0) {
                    return make_error (error_code::einval);
                }
                new_pos = static_cast<uoff_type> (offset);
                break;
            case seek_mode::cur:
                if (offset < 0) {
                    auto const positive_offset = static_cast<uoff_type> (-offset);
                    if (positive_offset > pos_) {
                        return make_error (error_code::einval);
                    }
                    new_pos = pos_ - positive_offset;
                } else {
                    new_pos = pos_ + static_cast<uoff_type> (offset);
                }
                break;
            case seek_mode::end:
                if (offset < 0 && static_cast<std::size_t> (-offset) > file_size) {
                    return make_error (error_code::einval);
                }
                new_pos = (offset >= 0) ? (file_size + static_cast<uoff_type> (offset))
                                        : (file_size - static_cast<uoff_type> (-offset));
                break;
            }

            pos_ = new_pos;
            return error_or<std::size_t>{new_pos};
        }